

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

ly_bool tro_read_if_sibling_exists(trt_tree_ctx *tc)

{
  void *local_18;
  void *parent;
  trt_tree_ctx *tc_local;
  
  if (tc->lysc_tree == '\0') {
    local_18 = trop_parent(tc->pn);
  }
  else {
    local_18 = troc_parent(tc->cn);
  }
  return local_18 != (void *)0x0;
}

Assistant:

static ly_bool
tro_read_if_sibling_exists(const struct trt_tree_ctx *tc)
{
    const void *parent;

    if (tc->lysc_tree) {
        parent = troc_parent(tc->cn);
    } else {
        parent = trop_parent(tc->pn);
    }

    return parent ? 1 : 0;
}